

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void VmExtractOptArgValue
               (jx9_value *pArray,jx9_value *pWorker,char *zArg,char *zArgEnd,int need_val,
               jx9_context *pCtx,char *zName)

{
  uint uVar1;
  ushort **ppuVar2;
  byte *pbVar3;
  byte *pbVar4;
  jx9_value *pValue;
  byte *pbVar5;
  char *pcVar6;
  byte bVar7;
  long lVar8;
  bool bVar9;
  
  jx9MemObjRelease(pWorker);
  (pWorker->x).rVal = 0.0;
  pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 8;
  if (need_val != 0) {
    pbVar4 = (byte *)(zArg + 1);
    if ((pbVar4 < zArgEnd) && (zArg[1] == '=')) {
      pbVar4 = (byte *)(zArg + 2);
    }
    bVar9 = pbVar4 < zArgEnd;
    if (bVar9) {
      bVar7 = *pbVar4;
      if (bVar7 < 0xc0) {
        ppuVar2 = __ctype_b_loc();
        pbVar3 = pbVar4 + 1;
        pcVar6 = zArgEnd + ~(ulong)pbVar4;
        do {
          if ((*(byte *)((long)*ppuVar2 + (long)(char)bVar7 * 2 + 1) & 0x20) == 0) break;
          if (pcVar6 == (char *)0x0) goto LAB_0012da60;
          bVar9 = pbVar3 < zArgEnd;
          bVar7 = *pbVar3;
          pbVar3 = pbVar3 + 1;
          pcVar6 = pcVar6 + -1;
        } while (bVar7 < 0xc0);
        pbVar4 = pbVar3 + -1;
      }
      if (bVar9) {
        bVar7 = *pbVar4;
        if ((bVar7 == 0x22) || (bVar7 == 0x27)) {
          pbVar4 = pbVar4 + 1;
          pbVar3 = pbVar4;
          for (pbVar5 = pbVar4;
              (pbVar5 < zArgEnd && ((*pbVar5 != bVar7 || (pbVar3 = pbVar5, pbVar5[-1] == 0x5c))));
              pbVar5 = pbVar5 + 1) {
            pbVar3 = (byte *)zArgEnd;
          }
          jx9_value_string(pWorker,(char *)pbVar4,(int)pbVar3 - (int)pbVar4);
          pbVar3 = pbVar3 + (pbVar5 < zArgEnd);
        }
        else {
          if (bVar7 == 0x2d) goto LAB_0012da60;
          pbVar3 = pbVar4;
          if (pbVar4 < zArgEnd) {
            ppuVar2 = __ctype_b_loc();
            pbVar5 = pbVar4;
            do {
              pbVar3 = pbVar5;
              if ((*(byte *)((long)*ppuVar2 + (long)(char)*pbVar5 * 2 + 1) & 0x20) != 0) break;
              pbVar5 = pbVar5 + 1;
              pbVar3 = (byte *)zArgEnd;
            } while (pbVar5 < zArgEnd);
          }
          jx9_value_string(pWorker,(char *)pbVar4,(int)pbVar3 - (int)pbVar4);
        }
        if (pbVar3 < zArgEnd) {
          lVar8 = (long)zArgEnd - (long)pbVar3;
          do {
            bVar7 = *pbVar3;
            if ((0xffffffffffffffbf < (ulong)(long)(char)bVar7) ||
               (ppuVar2 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar2 + (long)(char)bVar7 * 2 + 1) & 0x20) == 0)) {
              if (bVar7 != 0x2d) {
                pValue = jx9_context_new_array(pCtx);
                if (pValue == (jx9_value *)0x0) {
                  jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"JX9 is running out of memory");
                  return;
                }
                if ((pValue->iFlags & 0x40) != 0) {
                  HashmapInsert((jx9_hashmap *)(pValue->x).pOther,(jx9_value *)0x0,pWorker);
                }
                do {
                  do {
                    if ((zArgEnd <= pbVar3) || (*pbVar3 == 0x2d)) {
                      jx9_array_add_strkey_elem(pArray,zName,pValue);
                      jx9_context_release_value(pCtx,pValue);
                      return;
                    }
                    pbVar3 = pbVar3 + (*pbVar3 == 0x5c);
                    pbVar4 = pbVar3;
                    if (pbVar3 < zArgEnd) {
                      ppuVar2 = __ctype_b_loc();
                      pbVar5 = pbVar3;
                      do {
                        pbVar4 = pbVar5;
                        if ((*(byte *)((long)*ppuVar2 + (long)(char)*pbVar5 * 2 + 1) & 0x20) != 0)
                        break;
                        pbVar5 = pbVar5 + 1;
                        pbVar4 = (byte *)zArgEnd;
                      } while (pbVar5 < zArgEnd);
                    }
                    (pWorker->sBlob).nByte = 0;
                    uVar1 = (pWorker->sBlob).nFlags;
                    if ((uVar1 & 4) != 0) {
                      (pWorker->sBlob).pBlob = (void *)0x0;
                      (pWorker->sBlob).mByte = 0;
                      (pWorker->sBlob).nFlags = uVar1 & 0xfffffffb;
                    }
                    jx9_value_string(pWorker,(char *)pbVar3,(int)pbVar4 - (int)pbVar3);
                    if ((pValue->iFlags & 0x40) != 0) {
                      HashmapInsert((jx9_hashmap *)(pValue->x).pOther,(jx9_value *)0x0,pWorker);
                    }
                    pbVar3 = pbVar4;
                  } while (zArgEnd <= pbVar4);
                  lVar8 = (long)zArgEnd - (long)pbVar4;
                  do {
                    bVar7 = *pbVar4;
                    pbVar3 = pbVar4;
                    if ((0xffffffffffffffbf < (ulong)(long)(char)bVar7) ||
                       (ppuVar2 = __ctype_b_loc(),
                       (*(byte *)((long)*ppuVar2 + (long)(char)bVar7 * 2 + 1) & 0x20) == 0)) break;
                    pbVar4 = pbVar4 + 1;
                    lVar8 = lVar8 + -1;
                    pbVar3 = (byte *)zArgEnd;
                  } while (lVar8 != 0);
                } while( true );
              }
              break;
            }
            pbVar3 = pbVar3 + 1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
      }
    }
  }
LAB_0012da60:
  jx9_array_add_strkey_elem(pArray,zName,pWorker);
  return;
}

Assistant:

static void VmExtractOptArgValue(
	jx9_value *pArray,  /* getopt() return value */
	jx9_value *pWorker, /* Worker variable */
	const char *zArg,   /* Argument stream */
	const char *zArgEnd, /* End of the argument stream  */
	int need_val,       /* TRUE to fetch option argument */
	jx9_context *pCtx,  /* Call Context */
	const char *zName   /* Option name */)
{
	jx9_value_bool(pWorker, 0);
	if( !need_val ){
		/* 
		 * Option does not need arguments.
		 * Insert the option name and a boolean FALSE.
		 */
		jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
	}else{
		const char *zCur;
		/* Extract option argument */
		zArg++;
		if( zArg < zArgEnd && zArg[0] == '=' ){
			zArg++;
		}
		while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
			zArg++;
		}
		if( zArg >= zArgEnd || zArg[0] == '-' ){
			/*
			 * Argument not found.
			 * Insert the option name and a boolean FALSE.
			 */
			jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
			return;
		}
		/* Delimit the value */
		zCur = zArg;
		if( zArg[0] == '\'' || zArg[0] == '"' ){
			int d = zArg[0];
			/* Delimt the argument */
			zArg++;
			zCur = zArg;
			while( zArg < zArgEnd ){
				if( zArg[0] == d && zArg[-1] != '\\' ){
					/* Delimiter found, exit the loop  */
					break;
				}
				zArg++;
			}
			/* Save the value */
			jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
			if( zArg < zArgEnd ){ zArg++; }
		}else{
			while( zArg < zArgEnd && !SyisSpace(zArg[0]) ){
				zArg++;
			}
			/* Save the value */
			jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
		}
		/*
		 * Check if we are dealing with multiple values.
		 * If so, create an array to hold them, rather than a scalar variable.
		 */
		while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
			zArg++;
		}
		if( zArg < zArgEnd && zArg[0] != '-' ){
			jx9_value *pOptArg; /* Array of option arguments */
			pOptArg = jx9_context_new_array(pCtx);
			if( pOptArg == 0 ){
				jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			}else{
				/* Insert the first value */
				jx9_array_add_elem(pOptArg, 0, pWorker); /* Will make it's own copy */
				for(;;){
					if( zArg >= zArgEnd || zArg[0] == '-' ){
						/* No more value */
						break;
					}
					/* Delimit the value */
					zCur = zArg;
					if( zArg < zArgEnd && zArg[0] == '\\' ){
						zArg++;
						zCur = zArg;
					}
					while( zArg < zArgEnd && !SyisSpace(zArg[0]) ){
						zArg++;
					}
					/* Reset the string cursor */
					jx9_value_reset_string_cursor(pWorker);
					/* Save the value */
					jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
					/* Insert */
					jx9_array_add_elem(pOptArg, 0, pWorker); /* Will make it's own copy */
					/* Jump trailing white spaces */
					while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
						zArg++;
					}
				}
				/* Insert the option arg array */
				jx9_array_add_strkey_elem(pArray, (const char *)zName, pOptArg); /* Will make it's own copy */
				/* Safely release */
				jx9_context_release_value(pCtx, pOptArg);
			}
		}else{
			/* Single value */
			jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
		}
	}
}